

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr Infoclr_change_bg(Pixell bg)

{
  errr in_EAX;
  errr eVar1;
  
  if (metadpy_default_15 < bg) {
    return in_EAX;
  }
  eVar1 = XSetBackground(metadpy_default_0,Infoclr->gc,bg);
  return eVar1;
}

Assistant:

static errr Infoclr_change_bg(Pixell bg)
{
	infoclr *iclr = Infoclr;


	/*** Simple error checking of opr and clr ***/

	/* Check the 'Pixells' for realism */
	if (bg > Metadpy->zg) return (-1);

	/*** Change ***/

	/* Change */
	XSetBackground(Metadpy->dpy, iclr->gc, bg);

	/* Success */
	return (0);
}